

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O2

monst * findgd(void)

{
  boolean bVar1;
  monst *pmVar2;
  
  pmVar2 = (monst *)&level->monlist;
  do {
    pmVar2 = pmVar2->nmon;
    if (pmVar2 == (monst *)0x0) {
      return (monst *)0x0;
    }
  } while ((((pmVar2->field_0x63 & 8) == 0) || (pmVar2->mhp < 1)) ||
          (bVar1 = on_level((d_level *)((long)&pmVar2[1].data + 4),&u.uz), bVar1 == '\0'));
  return pmVar2;
}

Assistant:

static struct monst *findgd(void)
{
	struct monst *mtmp;

	for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon)
	    if (mtmp->isgd && !DEADMONSTER(mtmp) && on_level(&(EGD(mtmp)->gdlevel), &u.uz))
		return mtmp;
	return NULL;
}